

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_get_table(sqlite3 *db,char *zSql,char ***pazResult,int *pnRow,int *pnColumn,
                     char **pzErrMsg)

{
  char *pcVar1;
  char **ppcVar2;
  char **azNew;
  TabResult res;
  int rc;
  char **pzErrMsg_local;
  int *pnColumn_local;
  int *pnRow_local;
  char ***pazResult_local;
  char *zSql_local;
  sqlite3 *db_local;
  
  *pazResult = (char **)0x0;
  if (pnColumn != (int *)0x0) {
    *pnColumn = 0;
  }
  if (pnRow != (int *)0x0) {
    *pnRow = 0;
  }
  if (pzErrMsg != (char **)0x0) {
    *pzErrMsg = (char *)0x0;
  }
  res.azResult = (char **)0x0;
  res.zErrMsg._4_4_ = 0;
  res.nAlloc = 0;
  res.nRow = 1;
  res.zErrMsg._0_4_ = 0x14;
  res.nColumn = 0;
  azNew = (char **)sqlite3_malloc64(0xa0);
  if (azNew == (char **)0x0) {
    db->errCode = 7;
    db_local._4_4_ = 7;
  }
  else {
    *azNew = (char *)0x0;
    res._36_4_ = sqlite3_exec(db,zSql,sqlite3_get_table_cb,&azNew,pzErrMsg);
    *azNew = (char *)(ulong)res.nRow;
    if ((res._36_4_ & 0xff) == 4) {
      sqlite3_free_table(azNew + 1);
      if (res.azResult != (char **)0x0) {
        if (pzErrMsg != (char **)0x0) {
          sqlite3_free(*pzErrMsg);
          pcVar1 = sqlite3_mprintf("%s",res.azResult);
          *pzErrMsg = pcVar1;
        }
        sqlite3_free(res.azResult);
      }
      db->errCode = res.nColumn;
      db_local._4_4_ = res.nColumn;
    }
    else {
      sqlite3_free(res.azResult);
      if (res._36_4_ == 0) {
        ppcVar2 = azNew;
        if ((res.nRow < (uint)res.zErrMsg) &&
           (ppcVar2 = (char **)sqlite3_realloc64(azNew,(ulong)res.nRow << 3),
           ppcVar2 == (char **)0x0)) {
          sqlite3_free_table(azNew + 1);
          db->errCode = 7;
          db_local._4_4_ = 7;
        }
        else {
          azNew = ppcVar2;
          *pazResult = azNew + 1;
          if (pnColumn != (int *)0x0) {
            *pnColumn = res.nAlloc;
          }
          if (pnRow != (int *)0x0) {
            *pnRow = res.zErrMsg._4_4_;
          }
          db_local._4_4_ = res._36_4_;
        }
      }
      else {
        sqlite3_free_table(azNew + 1);
        db_local._4_4_ = res._36_4_;
      }
    }
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_get_table(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  char ***pazResult,          /* Write the result table here */
  int *pnRow,                 /* Write the number of rows in the result here */
  int *pnColumn,              /* Write the number of columns of result here */
  char **pzErrMsg             /* Write error messages here */
){
  int rc;
  TabResult res;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pazResult==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *pazResult = 0;
  if( pnColumn ) *pnColumn = 0;
  if( pnRow ) *pnRow = 0;
  if( pzErrMsg ) *pzErrMsg = 0;
  res.zErrMsg = 0;
  res.nRow = 0;
  res.nColumn = 0;
  res.nData = 1;
  res.nAlloc = 20;
  res.rc = SQLITE_OK;
  res.azResult = sqlite3_malloc64(sizeof(char*)*res.nAlloc );
  if( res.azResult==0 ){
     db->errCode = SQLITE_NOMEM;
     return SQLITE_NOMEM_BKPT;
  }
  res.azResult[0] = 0;
  rc = sqlite3_exec(db, zSql, sqlite3_get_table_cb, &res, pzErrMsg);
  assert( sizeof(res.azResult[0])>= sizeof(res.nData) );
  res.azResult[0] = SQLITE_INT_TO_PTR(res.nData);
  if( (rc&0xff)==SQLITE_ABORT ){
    sqlite3_free_table(&res.azResult[1]);
    if( res.zErrMsg ){
      if( pzErrMsg ){
        sqlite3_free(*pzErrMsg);
        *pzErrMsg = sqlite3_mprintf("%s",res.zErrMsg);
      }
      sqlite3_free(res.zErrMsg);
    }
    db->errCode = res.rc;  /* Assume 32-bit assignment is atomic */
    return res.rc;
  }
  sqlite3_free(res.zErrMsg);
  if( rc!=SQLITE_OK ){
    sqlite3_free_table(&res.azResult[1]);
    return rc;
  }
  if( res.nAlloc>res.nData ){
    char **azNew;
    azNew = sqlite3_realloc64( res.azResult, sizeof(char*)*res.nData );
    if( azNew==0 ){
      sqlite3_free_table(&res.azResult[1]);
      db->errCode = SQLITE_NOMEM;
      return SQLITE_NOMEM_BKPT;
    }
    res.azResult = azNew;
  }
  *pazResult = &res.azResult[1];
  if( pnColumn ) *pnColumn = res.nColumn;
  if( pnRow ) *pnRow = res.nRow;
  return rc;
}